

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_ciphersuite_match
              (mbedtls_ssl_context *ssl,int suite_id,mbedtls_ssl_ciphersuite_t **ciphersuite_info)

{
  int iVar1;
  mbedtls_ssl_ciphersuite_t *info;
  mbedtls_ssl_ciphersuite_t *suite_info;
  mbedtls_ssl_ciphersuite_t **ciphersuite_info_local;
  int suite_id_local;
  mbedtls_ssl_context *ssl_local;
  
  info = mbedtls_ssl_ciphersuite_from_id(suite_id);
  if (info == (mbedtls_ssl_ciphersuite_t *)0x0) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x2cc,"should never happen");
    ssl_local._4_4_ = -0x6c00;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
               ,0x2d0,"trying ciphersuite: %s",info->name);
    if ((ssl->minor_ver < info->min_minor_ver) || (info->max_minor_ver < ssl->minor_ver)) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x2d5,"ciphersuite mismatch: version");
      ssl_local._4_4_ = 0;
    }
    else if (((*(uint *)&ssl->conf->field_0x174 >> 1 & 1) == 1) && ((info->flags & 4) != 0)) {
      ssl_local._4_4_ = 0;
    }
    else if (((*(uint *)&ssl->conf->field_0x174 >> 6 & 1) == 1) &&
            (info->cipher == MBEDTLS_CIPHER_ARC4_128)) {
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                 ,0x2e3,"ciphersuite mismatch: rc4");
      ssl_local._4_4_ = 0;
    }
    else {
      iVar1 = mbedtls_ssl_ciphersuite_uses_ec(info);
      if ((iVar1 == 0) ||
         ((ssl->handshake->curves != (mbedtls_ecp_curve_info **)0x0 &&
          (*ssl->handshake->curves != (mbedtls_ecp_curve_info *)0x0)))) {
        iVar1 = mbedtls_ssl_ciphersuite_uses_psk(info);
        if (((iVar1 == 0) ||
            (ssl->conf->f_psk != (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0)
            ) || ((((ssl->conf->psk != (uchar *)0x0 && (ssl->conf->psk_identity != (uchar *)0x0)) &&
                   (ssl->conf->psk_identity_len != 0)) && (ssl->conf->psk_len != 0)))) {
          iVar1 = ssl_pick_cert(ssl,info);
          if (iVar1 == 0) {
            *ciphersuite_info = info;
            ssl_local._4_4_ = 0;
          }
          else {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                       ,0x316,"ciphersuite mismatch: no suitable certificate");
            ssl_local._4_4_ = 0;
          }
        }
        else {
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                     ,0x306,"ciphersuite mismatch: no pre-shared key");
          ssl_local._4_4_ = 0;
        }
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
                   ,0x2f9,"ciphersuite mismatch: no common elliptic curve");
        ssl_local._4_4_ = 0;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_ciphersuite_match( mbedtls_ssl_context *ssl, int suite_id,
                                  const mbedtls_ssl_ciphersuite_t **ciphersuite_info )
{
    const mbedtls_ssl_ciphersuite_t *suite_info;

    suite_info = mbedtls_ssl_ciphersuite_from_id( suite_id );
    if( suite_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "trying ciphersuite: %s", suite_info->name ) );

    if( suite_info->min_minor_ver > ssl->minor_ver ||
        suite_info->max_minor_ver < ssl->minor_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: version" ) );
        return( 0 );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ( suite_info->flags & MBEDTLS_CIPHERSUITE_NODTLS ) )
        return( 0 );
#endif

#if defined(MBEDTLS_ARC4_C)
    if( ssl->conf->arc4_disabled == MBEDTLS_SSL_ARC4_DISABLED &&
            suite_info->cipher == MBEDTLS_CIPHER_ARC4_128 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: rc4" ) );
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECJPAKE_ENABLED)
    if( suite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE &&
        ( ssl->handshake->cli_exts & MBEDTLS_TLS_EXT_ECJPAKE_KKPP_OK ) == 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: ecjpake "
                                    "not configured or ext missing" ) );
        return( 0 );
    }
#endif


#if defined(MBEDTLS_ECDH_C) || defined(MBEDTLS_ECDSA_C)
    if( mbedtls_ssl_ciphersuite_uses_ec( suite_info ) &&
        ( ssl->handshake->curves == NULL ||
          ssl->handshake->curves[0] == NULL ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: "
                            "no common elliptic curve" ) );
        return( 0 );
    }
#endif

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    /* If the ciphersuite requires a pre-shared key and we don't
     * have one, skip it now rather than failing later */
    if( mbedtls_ssl_ciphersuite_uses_psk( suite_info ) &&
        ssl->conf->f_psk == NULL &&
        ( ssl->conf->psk == NULL || ssl->conf->psk_identity == NULL ||
          ssl->conf->psk_identity_len == 0 || ssl->conf->psk_len == 0 ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: no pre-shared key" ) );
        return( 0 );
    }
#endif

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    /*
     * Final check: if ciphersuite requires us to have a
     * certificate/key of a particular type:
     * - select the appropriate certificate if we have one, or
     * - try the next ciphersuite if we don't
     * This must be done last since we modify the key_cert list.
     */
    if( ssl_pick_cert( ssl, suite_info ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite mismatch: "
                            "no suitable certificate" ) );
        return( 0 );
    }
#endif

    *ciphersuite_info = suite_info;
    return( 0 );
}